

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.h
# Opt level: O2

string * __thiscall Tools::CheckLine(string *__return_storage_ptr__,Tools *this,string *arg)

{
  bool bVar1;
  allocator<char> local_11;
  
  bVar1 = std::operator!=(arg,".");
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)arg);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"dot",&local_11);
  }
  return __return_storage_ptr__;
}

Assistant:

string CheckLine(string arg) {
        if (arg != ".") {
            return arg;
        }

        return "dot";
    }